

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_inc.h
# Opt level: O1

void CreateBackwardReferencesNH40
               (size_t num_bytes,size_t position,uint8_t *ringbuffer,size_t ringbuffer_mask,
               ContextLut literal_context_lut,BrotliEncoderParams *params,Hasher *hasher,
               int *dist_cache,size_t *last_insert_len,Command *commands,size_t *num_commands,
               size_t *num_literals,BackwardReferenceFromDecoder *backward_references,
               size_t *back_refs_position,size_t back_refs_size)

{
  ulong uVar1;
  long lVar2;
  uint uVar3;
  uint uVar4;
  long lVar5;
  long lVar6;
  bool bVar7;
  size_t sVar8;
  ulong uVar9;
  ulong uVar10;
  int iVar11;
  ulong uVar12;
  ulong uVar13;
  size_t *psVar14;
  int *piVar15;
  ulong uVar16;
  ulong uVar17;
  undefined8 uVar18;
  void *pvVar19;
  ulong uVar20;
  byte bVar21;
  ushort uVar22;
  ulong uVar23;
  char *pcVar24;
  int iVar25;
  int iVar26;
  size_t sVar27;
  size_t *psVar28;
  size_t sVar29;
  ulong uVar30;
  ulong uVar31;
  long lVar32;
  ulong uVar33;
  ulong uVar34;
  ushort uVar35;
  ulong uVar36;
  ulong uVar37;
  ulong uVar38;
  ulong uVar39;
  size_t *psVar40;
  ulong uVar41;
  ulong uVar42;
  long lVar43;
  ulong uVar44;
  long lVar45;
  int *piVar46;
  long lVar47;
  char cVar48;
  uint uVar49;
  long lVar50;
  long lVar51;
  uint uVar52;
  uint uVar53;
  int iVar54;
  size_t sVar55;
  ulong uVar56;
  size_t sVar57;
  ulong uVar58;
  ulong uVar59;
  bool bVar60;
  bool bVar61;
  ulong local_148;
  int *local_138;
  ulong local_128;
  ulong local_118;
  ulong local_108;
  ulong local_100;
  ulong local_e8;
  ulong local_d0;
  long local_c8;
  size_t *local_b0;
  ulong local_a8;
  
  local_e8 = *(ulong *)dist_cache;
  uVar1 = position + num_bytes;
  uVar12 = (position - 3) + num_bytes;
  if (num_bytes < 4) {
    uVar12 = position;
  }
  lVar50 = 0x200;
  if (*(int *)(literal_context_lut + 4) < 9) {
    lVar50 = 0x40;
  }
  if (position + 4 < uVar1) {
    uVar36 = (1L << (literal_context_lut[8] & 0x3f)) - 0x10;
    lVar5 = *(long *)(literal_context_lut + 0x10);
    local_a8 = lVar50 + position;
    lVar2 = position - 1;
    local_b0 = last_insert_len;
    sVar27 = position;
    do {
      uVar38 = uVar36;
      if (sVar27 < uVar36) {
        uVar38 = sVar27;
      }
      uVar42 = lVar5 + sVar27;
      if (uVar36 <= lVar5 + sVar27) {
        uVar42 = uVar36;
      }
      uVar37 = *(ulong *)(literal_context_lut + 0x50);
      uVar13 = sVar27 & ringbuffer_mask;
      iVar26 = *(int *)(ringbuffer + uVar13);
      lVar47 = *(long *)&params->dist;
      psVar28 = *(size_t **)backward_references;
      bVar60 = psVar28 < back_refs_position;
      if ((bVar60) && ((ulong)(long)(int)num_literals[(long)psVar28 * 2] < sVar27)) {
        psVar14 = num_literals + (long)psVar28 * 2 + 2;
        psVar40 = psVar28;
        do {
          psVar40 = (size_t *)((long)psVar40 + 1);
          psVar28 = back_refs_position;
          if (back_refs_position == psVar40) break;
          sVar8 = *psVar14;
          psVar14 = psVar14 + 2;
          psVar28 = psVar40;
        } while ((ulong)(long)(int)sVar8 < sVar27);
        *(size_t **)backward_references = psVar40;
        bVar60 = psVar40 < back_refs_position;
      }
      uVar31 = uVar1 - sVar27;
      piVar15 = (int *)(ringbuffer + uVar13);
      if ((bVar60) && (sVar27 == (long)(int)num_literals[(long)psVar28 * 2])) {
        uVar49 = (uint)num_literals[(long)psVar28 * 2 + 1];
        local_108 = (ulong)(int)uVar49;
        local_100 = 0x7e4;
        bVar61 = true;
        if (sVar27 - local_108 < sVar27) {
          if (*(uint *)((long)num_literals + (long)psVar28 * 0x10 + 0xc) < uVar49) {
            bVar60 = false;
            local_108 = 0;
            sVar55 = 0;
          }
          else {
            uVar16 = sVar27 - local_108 & ringbuffer_mask;
            if (7 < uVar31) {
              uVar34 = uVar31 & 0xfffffffffffffff8;
              local_138 = (int *)(ringbuffer + uVar34 + uVar13);
              lVar47 = 0;
              uVar13 = 0;
LAB_00109394:
              if (*(ulong *)(piVar15 + uVar13 * 2) == *(ulong *)(ringbuffer + uVar13 * 8 + uVar16))
              goto code_r0x001093a6;
              uVar16 = *(ulong *)(ringbuffer + uVar13 * 8 + uVar16) ^
                       *(ulong *)(piVar15 + uVar13 * 2);
              uVar13 = 0;
              if (uVar16 != 0) {
                for (; (uVar16 >> uVar13 & 1) == 0; uVar13 = uVar13 + 1) {
                }
              }
              uVar13 = (uVar13 >> 3 & 0x1fffffff) - lVar47;
              goto LAB_001093fc;
            }
            uVar34 = 0;
            local_138 = piVar15;
LAB_00109843:
            uVar17 = uVar31 & 7;
            uVar13 = uVar34;
            if (uVar17 != 0) {
              uVar58 = uVar34 | uVar17;
              do {
                uVar13 = uVar34;
                if (ringbuffer[uVar34 + uVar16] != (uint8_t)*local_138) break;
                local_138 = (int *)((long)local_138 + 1);
                uVar34 = uVar34 + 1;
                uVar17 = uVar17 - 1;
                uVar13 = uVar58;
              } while (uVar17 != 0);
            }
LAB_001093fc:
            sVar55 = (size_t)*(int *)((long)num_literals + (long)psVar28 * 0x10 + 4);
            if (uVar13 < sVar55) {
              sVar55 = uVar13;
            }
            iVar26 = 0x1f;
            if (uVar49 != 0) {
              for (; uVar49 >> iVar26 == 0; iVar26 = iVar26 + -1) {
              }
            }
            local_100 = (ulong)(iVar26 * -0x1e + 0x780) + sVar55 * 0x87;
            bVar60 = true;
            bVar61 = false;
          }
        }
        else {
          bVar60 = false;
          local_108 = 0;
          sVar55 = 0;
        }
        iVar26 = 0;
        if (bVar61) goto LAB_00108260;
      }
      else {
        uVar49 = (uint)(iVar26 * 0x1e35a7bd) >> 0x11;
        uVar17 = (ulong)uVar49;
        uVar34 = (ulong)((uint)uVar31 & 7);
        uVar16 = uVar31 & 0xfffffffffffffff8;
        local_148 = 0x7e4;
        local_118 = 0;
        lVar43 = 0;
        sVar55 = 0;
        local_108 = 0;
        local_100 = 0x7e4;
        do {
          uVar58 = (ulong)*(int *)((long)&(hasher->common).extra + lVar43 * 4);
          uVar20 = sVar27 - uVar58;
          cVar48 = (char)uVar49;
          if ((((lVar43 == 0) || (*(char *)(lVar47 + 0x30000 + (uVar20 & 0xffff)) == cVar48)) &&
              (uVar58 <= uVar38)) && (uVar20 < sVar27)) {
            if (7 < uVar31) {
              lVar45 = 0;
              uVar39 = 0;
LAB_00107eb5:
              if (*(ulong *)(piVar15 + uVar39 * 2) ==
                  *(ulong *)(ringbuffer + uVar39 * 8 + (uVar20 & ringbuffer_mask)))
              goto code_r0x00107ec7;
              uVar39 = *(ulong *)(ringbuffer + uVar39 * 8 + (uVar20 & ringbuffer_mask)) ^
                       *(ulong *)(piVar15 + uVar39 * 2);
              uVar20 = 0;
              if (uVar39 != 0) {
                for (; (uVar39 >> uVar20 & 1) == 0; uVar20 = uVar20 + 1) {
                }
              }
              uVar39 = (uVar20 >> 3 & 0x1fffffff) - lVar45;
              goto LAB_00107f02;
            }
            piVar46 = piVar15;
            uVar33 = 0;
LAB_00107f8e:
            uVar39 = uVar33;
            if (uVar34 != 0) {
              uVar44 = uVar34 | uVar33;
              uVar23 = uVar34;
              do {
                uVar39 = uVar33;
                if (ringbuffer[uVar33 + (uVar20 & ringbuffer_mask)] != (uint8_t)*piVar46) break;
                piVar46 = (int *)((long)piVar46 + 1);
                uVar33 = uVar33 + 1;
                uVar23 = uVar23 - 1;
                uVar39 = uVar44;
              } while (uVar23 != 0);
            }
LAB_00107f02:
            if ((bVar60) &&
               (uVar20 = (ulong)(int)num_literals[(long)psVar28 * 2], uVar20 < uVar39 + sVar27)) {
              uVar39 = uVar20 - sVar27;
            }
            if ((1 < uVar39) && (uVar20 = uVar39 * 0x87 + 0x78f, local_148 < uVar20)) {
              if (lVar43 != 0) {
                uVar20 = uVar20 - ((0x1ca10U >> ((byte)lVar43 & 2) & 4) + 0x27);
              }
              if (local_148 < uVar20) {
                sVar55 = uVar39;
                local_100 = uVar20;
                local_148 = uVar20;
                local_118 = uVar39;
                local_108 = uVar58;
              }
            }
          }
          lVar43 = lVar43 + 1;
        } while (lVar43 != 4);
        lVar43 = *(long *)&(params->hasher).num_last_distances_to_check;
        uVar39 = sVar27 - *(uint *)(lVar47 + uVar17 * 4);
        uVar35 = *(ushort *)(lVar47 + 0x20000 + uVar17 * 2);
        uVar34 = (ulong)uVar35;
        uVar20 = (ulong)((uint)uVar31 & 7);
        uVar33 = 0;
        uVar58 = uVar39;
        do {
          bVar61 = lVar43 == 0;
          lVar43 = lVar43 + -1;
          if (bVar61) break;
          uVar33 = uVar33 + uVar58;
          uVar23 = local_100;
          uVar44 = sVar55;
          uVar30 = local_148;
          uVar56 = local_118;
          uVar59 = local_108;
          if (uVar33 <= uVar38) {
            uVar41 = (ulong)*(ushort *)(lVar47 + 0x40002 + uVar34 * 4);
            uVar58 = (ulong)*(ushort *)(lVar47 + 0x40000 + uVar34 * 4);
            uVar34 = uVar41;
            if (local_118 + uVar13 <= ringbuffer_mask) {
              uVar41 = sVar27 - uVar33 & ringbuffer_mask;
              if ((uVar41 + local_118 <= ringbuffer_mask) &&
                 (ringbuffer[local_118 + uVar13] == ringbuffer[uVar41 + local_118])) {
                if (7 < uVar31) {
                  lVar45 = 0;
                  uVar23 = 0;
LAB_001080b1:
                  if (*(ulong *)(piVar15 + uVar23 * 2) ==
                      *(ulong *)(ringbuffer + uVar23 * 8 + uVar41)) goto code_r0x001080c3;
                  uVar44 = *(ulong *)(ringbuffer + uVar23 * 8 + uVar41) ^
                           *(ulong *)(piVar15 + uVar23 * 2);
                  uVar23 = 0;
                  if (uVar44 != 0) {
                    for (; (uVar44 >> uVar23 & 1) == 0; uVar23 = uVar23 + 1) {
                    }
                  }
                  uVar44 = (uVar23 >> 3 & 0x1fffffff) - lVar45;
                  goto LAB_0010810b;
                }
                piVar46 = piVar15;
                uVar30 = 0;
LAB_00108187:
                uVar44 = uVar30;
                if (uVar20 != 0) {
                  uVar56 = uVar20 | uVar30;
                  uVar23 = uVar20;
                  do {
                    uVar44 = uVar30;
                    if (ringbuffer[uVar30 + uVar41] != (uint8_t)*piVar46) break;
                    piVar46 = (int *)((long)piVar46 + 1);
                    uVar30 = uVar30 + 1;
                    uVar23 = uVar23 - 1;
                    uVar44 = uVar56;
                  } while (uVar23 != 0);
                }
LAB_0010810b:
                if ((bVar60) &&
                   (uVar23 = (ulong)(int)num_literals[(long)psVar28 * 2], uVar23 < uVar44 + sVar27))
                {
                  uVar44 = uVar23 - sVar27;
                }
                if (3 < uVar44) {
                  iVar26 = 0x1f;
                  if ((uint)uVar33 != 0) {
                    for (; (uint)uVar33 >> iVar26 == 0; iVar26 = iVar26 + -1) {
                    }
                  }
                  uVar23 = (ulong)(iVar26 * -0x1e + 0x780) + uVar44 * 0x87;
                  uVar30 = uVar23;
                  uVar56 = uVar44;
                  uVar59 = uVar33;
                  if (local_148 < uVar23) goto LAB_00108079;
                }
                uVar23 = local_100;
                uVar44 = sVar55;
                uVar30 = local_148;
                uVar56 = local_118;
                uVar59 = local_108;
              }
            }
          }
LAB_00108079:
          local_108 = uVar59;
          local_118 = uVar56;
          local_148 = uVar30;
          local_100 = uVar23;
          sVar55 = uVar44;
        } while (uVar33 <= uVar38);
        uVar22 = (ushort)(params->hasher).block_bits;
        *(ushort *)&(params->hasher).block_bits = uVar22 + 1;
        *(char *)(lVar47 + 0x30000 + (sVar27 & 0xffff)) = cVar48;
        if (0xfffe < uVar39) {
          uVar39 = 0xffff;
        }
        *(short *)(lVar47 + 0x40000 + (ulong)uVar22 * 4) = (short)uVar39;
        *(ushort *)(lVar47 + 0x40002 + (ulong)uVar22 * 4) = uVar35;
        *(int *)(lVar47 + uVar17 * 4) = (int)sVar27;
        *(ushort *)(lVar47 + 0x20000 + uVar17 * 2) = uVar22;
        bVar60 = false;
LAB_00108260:
        iVar26 = 0;
        if (local_100 == 0x7e4) {
          if (back_refs_position == (size_t *)0x0) {
            lVar47 = *(long *)&(params->dist).alphabet_size_max;
            if (*(ulong *)(lVar47 + 8) >> 7 <= *(ulong *)(lVar47 + 0x10)) {
              uVar38 = (ulong)((uint)(*piVar15 * 0x1e35a7bd) >> 0x11 & 0xfffffffe);
              lVar43 = *(long *)(literal_context_lut + 0x78);
              lVar45 = *(long *)(lVar47 + 8);
              iVar26 = 0;
              lVar51 = 0;
LAB_00109158:
              lVar45 = lVar45 + 1;
              *(long *)(lVar47 + 8) = lVar45;
              bVar21 = *(byte *)(lVar43 + uVar38);
              uVar13 = (ulong)bVar21;
              if (uVar13 != 0) {
                bVar61 = true;
                if (uVar13 <= uVar31) {
                  uVar16 = (ulong)*(ushort *)(*(long *)(literal_context_lut + 0x70) + uVar38 * 2);
                  lVar6 = *(long *)(literal_context_lut + 0x58);
                  pcVar24 = (char *)(uVar16 * uVar13 + *(long *)(lVar6 + 0xa8) +
                                    (ulong)*(uint *)(lVar6 + 0x20 + uVar13 * 4));
                  if (7 < bVar21) {
                    sVar57 = (size_t)(bVar21 & 0xfffffff8);
                    lVar32 = 0;
                    uVar34 = 0;
LAB_001091c4:
                    if (*(ulong *)(pcVar24 + uVar34 * 8) == *(ulong *)(piVar15 + uVar34 * 2))
                    goto code_r0x001091d6;
                    uVar17 = *(ulong *)(piVar15 + uVar34 * 2) ^ *(ulong *)(pcVar24 + uVar34 * 8);
                    uVar34 = 0;
                    if (uVar17 != 0) {
                      for (; (uVar17 >> uVar34 & 1) == 0; uVar34 = uVar34 + 1) {
                      }
                    }
                    uVar34 = (uVar34 >> 3 & 0x1fffffff) - lVar32;
                    goto LAB_0010922c;
                  }
                  sVar57 = 0;
                  goto LAB_00109311;
                }
                goto LAB_00109290;
              }
              goto LAB_001092aa;
            }
          }
          else {
            psVar28 = *(size_t **)backward_references;
            if ((psVar28 < back_refs_position) &&
               (sVar27 == (long)(int)num_literals[(long)psVar28 * 2])) {
              uVar49 = (uint)num_literals[(long)psVar28 * 2 + 1];
              if (*(int *)((long)num_literals + (long)psVar28 * 0x10 + 0xc) < (int)uVar49) {
                uVar52 = *(uint *)((long)num_literals + (long)psVar28 * 0x10 + 4);
                uVar42 = (ulong)uVar52;
                bVar60 = true;
                if (uVar52 - 4 < 0x15 && (int)uVar49 < 0x7ffffffd) {
                  uVar53 = ~(uint)uVar38 + uVar49;
                  lVar47 = *(long *)(literal_context_lut + 0x58);
                  iVar25 = (int)uVar53 >> (*(byte *)(lVar47 + uVar42) & 0x1f);
                  if (iVar25 < *(int *)(literal_context_lut + 0x60)) {
                    uVar3 = *(uint *)(lVar47 + 0x20 + uVar42 * 4);
                    uVar4 = kBitMask[*(byte *)(lVar47 + uVar42)];
                    lVar47 = *(long *)(lVar47 + 0xa8);
                    uVar18 = BrotliGetTransforms();
                    pvVar19 = malloc(uVar42 * 10);
                    iVar25 = BrotliTransformDictionaryWord
                                       (pvVar19,(ulong)uVar3 + lVar47 +
                                                (long)(int)((uVar53 & uVar4) * uVar52),uVar42,uVar18
                                        ,iVar25);
                    sVar57 = (size_t)iVar25;
                    iVar11 = bcmp(piVar15,pvVar19,sVar57);
                    if (iVar11 == 0) {
                      iVar26 = 0x1f;
                      if (uVar49 != 0) {
                        for (; uVar49 >> iVar26 == 0; iVar26 = iVar26 + -1) {
                        }
                      }
                      local_100 = (ulong)(iVar26 * -0x1e + 0x780) + sVar57 * 0x87;
                      iVar26 = uVar52 - iVar25;
                      local_108 = (long)(int)uVar49;
                      sVar55 = sVar57;
                    }
                    bVar60 = true;
                  }
                }
              }
            }
          }
        }
      }
LAB_001083cb:
      if (local_100 < 0x7e5) {
        local_e8 = local_e8 + 1;
        position = sVar27 + 1;
        if ((back_refs_position == (size_t *)0x0) && (local_a8 < position)) {
          if ((uint)((int)lVar50 * 4) + local_a8 < position) {
            uVar38 = sVar27 + 0x11;
            if (uVar1 - 4 <= sVar27 + 0x11) {
              uVar38 = uVar1 - 4;
            }
            if (uVar38 <= position) goto LAB_001097a1;
            lVar47 = *(long *)&params->dist;
            uVar35 = (ushort)(params->hasher).block_bits;
            do {
              uVar49 = (uint)(*(int *)(ringbuffer + (position & ringbuffer_mask)) * 0x1e35a7bd) >>
                       0x11;
              uVar42 = (ulong)uVar49;
              uVar37 = position - *(uint *)(lVar47 + uVar42 * 4);
              *(char *)(lVar47 + 0x30000 + (position & 0xffff)) = (char)uVar49;
              if (0xfffe < uVar37) {
                uVar37 = 0xffff;
              }
              uVar22 = uVar35 + 1;
              *(short *)(lVar47 + 0x40000 + (ulong)uVar35 * 4) = (short)uVar37;
              *(undefined2 *)(lVar47 + 0x40002 + (ulong)uVar35 * 4) =
                   *(undefined2 *)(lVar47 + 0x20000 + uVar42 * 2);
              *(int *)(lVar47 + uVar42 * 4) = (int)position;
              *(ushort *)(lVar47 + 0x20000 + uVar42 * 2) = uVar35;
              local_e8 = local_e8 + 4;
              position = position + 4;
              uVar35 = uVar22;
            } while (position < uVar38);
            goto LAB_0010978e;
          }
          uVar38 = sVar27 + 9;
          if (uVar1 - 3 <= sVar27 + 9) {
            uVar38 = uVar1 - 3;
          }
          if (position < uVar38) {
            lVar47 = *(long *)&params->dist;
            uVar35 = (ushort)(params->hasher).block_bits;
            do {
              uVar49 = (uint)(*(int *)(ringbuffer + (position & ringbuffer_mask)) * 0x1e35a7bd) >>
                       0x11;
              uVar42 = (ulong)uVar49;
              uVar37 = position - *(uint *)(lVar47 + uVar42 * 4);
              *(char *)(lVar47 + 0x30000 + (position & 0xffff)) = (char)uVar49;
              if (0xfffe < uVar37) {
                uVar37 = 0xffff;
              }
              uVar22 = uVar35 + 1;
              *(short *)(lVar47 + 0x40000 + (ulong)uVar35 * 4) = (short)uVar37;
              *(undefined2 *)(lVar47 + 0x40002 + (ulong)uVar35 * 4) =
                   *(undefined2 *)(lVar47 + 0x20000 + uVar42 * 2);
              *(int *)(lVar47 + uVar42 * 4) = (int)position;
              *(ushort *)(lVar47 + 0x20000 + uVar42 * 2) = uVar35;
              local_e8 = local_e8 + 2;
              position = position + 2;
              uVar35 = uVar22;
            } while (position < uVar38);
            goto LAB_0010978e;
          }
        }
      }
      else {
        if (!bVar60) {
          uVar38 = (lVar2 + num_bytes) - sVar27;
          iVar25 = 0;
          local_d0 = local_108;
LAB_00108550:
          uVar42 = uVar38 >> 3;
          uVar31 = uVar31 - 1;
          local_118 = sVar55 - 1;
          if (uVar31 <= sVar55 - 1) {
            local_118 = uVar31;
          }
          if (4 < *(int *)(literal_context_lut + 4)) {
            local_118 = 0;
          }
          uVar37 = sVar27 + 1;
          uVar13 = uVar36;
          if (uVar37 < uVar36) {
            uVar13 = uVar37;
          }
          uVar16 = lVar5 + sVar27 + 1;
          if (uVar36 <= uVar16) {
            uVar16 = uVar36;
          }
          uVar34 = *(ulong *)(literal_context_lut + 0x50);
          lVar47 = *(long *)&params->dist;
          uVar17 = uVar37 & ringbuffer_mask;
          iVar11 = *(int *)(ringbuffer + uVar17);
          piVar15 = (int *)(ringbuffer + uVar17);
          psVar28 = *(size_t **)backward_references;
          bVar60 = psVar28 < back_refs_position;
          if (!bVar60) {
LAB_001086d0:
            uVar49 = (uint)(iVar11 * 0x1e35a7bd) >> 0x11;
            uVar20 = (ulong)uVar49;
            uVar39 = (ulong)((uint)uVar31 & 7);
            local_148 = 0x7e4;
            lVar43 = 0;
            sVar57 = 0;
            local_128 = 0;
            uVar58 = 0x7e4;
LAB_00108711:
            uVar33 = (ulong)*(int *)((long)&(hasher->common).extra + lVar43 * 4);
            uVar23 = uVar37 - uVar33;
            cVar48 = (char)uVar49;
            if ((((lVar43 == 0) || (*(char *)(lVar47 + 0x30000 + (uVar23 & 0xffff)) == cVar48)) &&
                (uVar33 <= uVar13)) && (uVar23 < uVar37)) {
              uVar44 = uVar39;
              if (7 < uVar31) {
                lVar45 = 0;
                uVar30 = 0;
LAB_00108762:
                if (*(ulong *)(piVar15 + uVar30 * 2) ==
                    *(ulong *)(ringbuffer + uVar30 * 8 + (uVar23 & ringbuffer_mask)))
                goto code_r0x00108774;
                uVar44 = *(ulong *)(ringbuffer + uVar30 * 8 + (uVar23 & ringbuffer_mask)) ^
                         *(ulong *)(piVar15 + uVar30 * 2);
                uVar23 = 0;
                if (uVar44 != 0) {
                  for (; (uVar44 >> uVar23 & 1) == 0; uVar23 = uVar23 + 1) {
                  }
                }
                uVar30 = (uVar23 >> 3 & 0x1fffffff) - lVar45;
                goto LAB_001087a5;
              }
              uVar30 = 0;
              piVar46 = piVar15;
              goto joined_r0x00108836;
            }
            goto LAB_0010881d;
          }
          if ((ulong)(long)(int)num_literals[(long)psVar28 * 2] < uVar37) {
            psVar40 = num_literals + (long)psVar28 * 2 + 2;
            do {
              psVar28 = (size_t *)((long)psVar28 + 1);
              if (back_refs_position == psVar28) {
                *(size_t **)backward_references = psVar28;
                bVar60 = false;
                psVar28 = back_refs_position;
                goto LAB_001086d0;
              }
              sVar8 = *psVar40;
              psVar40 = psVar40 + 2;
            } while ((ulong)(long)(int)sVar8 < uVar37);
            *(size_t **)backward_references = psVar28;
            bVar60 = psVar28 < back_refs_position;
          }
          if ((!bVar60) || (uVar37 != (long)(int)num_literals[(long)psVar28 * 2]))
          goto LAB_001086d0;
          uVar49 = (uint)num_literals[(long)psVar28 * 2 + 1];
          local_128 = (ulong)(int)uVar49;
          uVar58 = 0x7e4;
          bVar61 = true;
          if (uVar37 - local_128 < uVar37) {
            if (*(uint *)((long)num_literals + (long)psVar28 * 0x10 + 0xc) < uVar49) {
              bVar60 = false;
              local_128 = 0;
              sVar57 = 0;
              goto LAB_00108fb9;
            }
            uVar17 = uVar37 - local_128 & ringbuffer_mask;
            if (7 < uVar31) {
              lVar47 = 0;
              uVar58 = 0;
LAB_00108f42:
              if (*(ulong *)(piVar15 + uVar58 * 2) == *(ulong *)(ringbuffer + uVar58 * 8 + uVar17))
              goto code_r0x00108f54;
              uVar17 = *(ulong *)(ringbuffer + uVar58 * 8 + uVar17) ^
                       *(ulong *)(piVar15 + uVar58 * 2);
              uVar42 = 0;
              if (uVar17 != 0) {
                for (; (uVar17 >> uVar42 & 1) == 0; uVar42 = uVar42 + 1) {
                }
              }
              uVar42 = (uVar42 >> 3 & 0x1fffffff) - lVar47;
              goto LAB_00108f80;
            }
            uVar42 = 0;
            piVar46 = piVar15;
            goto LAB_00109018;
          }
          bVar60 = false;
          local_128 = 0;
          sVar57 = 0;
          goto LAB_00108fb9;
        }
LAB_00108407:
        uVar38 = lVar5 + sVar27;
        if (uVar36 <= lVar5 + sVar27) {
          uVar38 = uVar36;
        }
        if (uVar38 < local_108) {
LAB_0010946c:
          uVar42 = local_108 + 0xf;
        }
        else {
          uVar42 = (ulong)*(int *)&(hasher->common).extra;
          uVar49 = 0;
          bVar60 = false;
          if (local_108 != uVar42) {
            uVar37 = (ulong)*(int *)((long)&(hasher->common).extra + 4);
            if (local_108 == uVar37) {
              uVar49 = 1;
            }
            else {
              uVar42 = (local_108 + 3) - uVar42;
              if (uVar42 < 7) {
                bVar21 = (byte)((int)uVar42 << 2);
                uVar49 = 0x9750468;
              }
              else {
                uVar37 = (local_108 + 3) - uVar37;
                if (6 < uVar37) {
                  if (local_108 != (long)(int)(hasher->common).dict_num_lookups) {
                    bVar60 = local_108 !=
                             (long)*(int *)((long)&(hasher->common).dict_num_lookups + 4);
                    uVar49 = 3;
                    goto LAB_00109468;
                  }
                  uVar49 = 2;
                  goto LAB_00109466;
                }
                bVar21 = (byte)((int)uVar37 << 2);
                uVar49 = 0xfdb1ace;
              }
              uVar49 = uVar49 >> (bVar21 & 0x1f) & 0xf;
            }
LAB_00109466:
            bVar60 = false;
          }
LAB_00109468:
          if (bVar60) goto LAB_0010946c;
          uVar42 = (ulong)uVar49;
        }
        if ((local_108 <= uVar38) && (uVar42 != 0)) {
          *(int *)((long)&(hasher->common).dict_num_lookups + 4) =
               (int)(hasher->common).dict_num_lookups;
          *(void **)((long)&(hasher->common).extra + 4) = (hasher->common).extra;
          *(int *)&(hasher->common).extra = (int)local_108;
        }
        uVar49 = (uint)local_e8;
        *(uint *)local_b0 = uVar49;
        *(uint *)((long)local_b0 + 4) = iVar26 << 0x19 | (uint)sVar55;
        uVar38 = (ulong)*(uint *)(literal_context_lut + 0x44) + 0x10;
        if (uVar42 < uVar38) {
          *(short *)((long)local_b0 + 0xe) = (short)uVar42;
          uVar52 = 0;
        }
        else {
          bVar21 = (byte)*(int *)(literal_context_lut + 0x40);
          uVar42 = ((uVar42 - *(uint *)(literal_context_lut + 0x44)) + (4L << (bVar21 & 0x3f))) -
                   0x10;
          uVar52 = 0x1f;
          if ((uint)uVar42 != 0) {
            for (; (uint)uVar42 >> uVar52 == 0; uVar52 = uVar52 - 1) {
            }
          }
          uVar52 = (uVar52 ^ 0xffffffe0) + 0x1f;
          bVar60 = (uVar42 >> ((ulong)uVar52 & 0x3f) & 1) != 0;
          iVar25 = uVar52 - *(int *)(literal_context_lut + 0x40);
          *(ushort *)((long)local_b0 + 0xe) =
               (short)((uint)bVar60 + iVar25 * 2 + 0xfffe << (bVar21 & 0x3f)) +
               (short)uVar38 + (~(ushort)(-1 << (bVar21 & 0x1f)) & (ushort)uVar42) |
               (short)iVar25 * 0x400;
          uVar52 = (uint)(uVar42 - ((ulong)bVar60 + 2 << ((byte)uVar52 & 0x3f)) >> (bVar21 & 0x3f));
        }
        *(uint *)(local_b0 + 1) = uVar52;
        if (5 < local_e8) {
          if (local_e8 < 0x82) {
            uVar49 = 0x1f;
            uVar52 = (uint)(local_e8 - 2);
            if (uVar52 != 0) {
              for (; uVar52 >> uVar49 == 0; uVar49 = uVar49 - 1) {
              }
            }
            uVar49 = (int)(local_e8 - 2 >> ((char)(uVar49 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
                     (uVar49 ^ 0xffffffe0) * 2 + 0x40;
          }
          else if (local_e8 < 0x842) {
            uVar52 = 0x1f;
            if (uVar49 - 0x42 != 0) {
              for (; uVar49 - 0x42 >> uVar52 == 0; uVar52 = uVar52 - 1) {
              }
            }
            uVar49 = (uVar52 ^ 0xffe0) + 0x2a;
          }
          else {
            uVar49 = 0x15;
            if (0x1841 < local_e8) {
              uVar49 = (uint)(ushort)(0x17 - (local_e8 < 0x5842));
            }
          }
        }
        uVar52 = iVar26 + (uint)sVar55;
        if (uVar52 < 10) {
          uVar53 = uVar52 - 2;
        }
        else if (uVar52 < 0x86) {
          uVar52 = uVar52 - 6;
          uVar53 = 0x1f;
          if (uVar52 != 0) {
            for (; uVar52 >> uVar53 == 0; uVar53 = uVar53 - 1) {
            }
          }
          uVar53 = (int)((ulong)(long)(int)uVar52 >> ((char)(uVar53 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
                   (uVar53 ^ 0xffffffe0) * 2 + 0x42;
        }
        else {
          uVar53 = 0x17;
          if (uVar52 < 0x846) {
            uVar53 = 0x1f;
            if (uVar52 - 0x46 != 0) {
              for (; uVar52 - 0x46 >> uVar53 == 0; uVar53 = uVar53 - 1) {
              }
            }
            uVar53 = (uVar53 ^ 0xffe0) + 0x2c;
          }
        }
        uVar22 = (ushort)uVar53;
        uVar35 = (uVar22 & 7) + ((ushort)uVar49 & 7) * 8;
        if ((((*(ushort *)((long)local_b0 + 0xe) & 0x3ff) == 0) && ((ushort)uVar49 < 8)) &&
           (uVar22 < 0x10)) {
          if (7 < uVar22) {
            uVar35 = uVar35 | 0x40;
          }
        }
        else {
          iVar26 = ((uVar49 & 0xffff) >> 3) * 3 + ((uVar53 & 0xffff) >> 3);
          uVar35 = uVar35 + ((ushort)(0x520d40 >> ((char)iVar26 * '\x02' & 0x1fU)) & 0xc0) +
                            (short)iVar26 * 0x40 + 0x40;
        }
        *(ushort *)((long)local_b0 + 0xc) = uVar35;
        *num_commands = *num_commands + local_e8;
        position = sVar27 + sVar55;
        uVar38 = uVar12;
        if (position < uVar12) {
          uVar38 = position;
        }
        uVar42 = sVar27 + 2;
        if (local_108 < sVar55 >> 2) {
          uVar37 = position + local_108 * -4;
          if (uVar37 < uVar42) {
            uVar37 = uVar42;
          }
          uVar42 = uVar37;
          if (uVar38 < uVar37) {
            uVar42 = uVar38;
          }
        }
        local_a8 = lVar50 + sVar55 * 2 + sVar27;
        local_b0 = local_b0 + 2;
        if (uVar42 < uVar38) {
          lVar47 = *(long *)&params->dist;
          uVar35 = (ushort)(params->hasher).block_bits;
          do {
            uVar49 = (uint)(*(int *)(ringbuffer + (uVar42 & ringbuffer_mask)) * 0x1e35a7bd) >> 0x11;
            uVar37 = (ulong)uVar49;
            uVar13 = uVar42 - *(uint *)(lVar47 + uVar37 * 4);
            *(char *)(lVar47 + 0x30000 + (uVar42 & 0xffff)) = (char)uVar49;
            if (0xfffe < uVar13) {
              uVar13 = 0xffff;
            }
            uVar22 = uVar35 + 1;
            *(short *)(lVar47 + 0x40000 + (ulong)uVar35 * 4) = (short)uVar13;
            *(undefined2 *)(lVar47 + 0x40002 + (ulong)uVar35 * 4) =
                 *(undefined2 *)(lVar47 + 0x20000 + uVar37 * 2);
            *(int *)(lVar47 + uVar37 * 4) = (int)uVar42;
            *(ushort *)(lVar47 + 0x20000 + uVar37 * 2) = uVar35;
            uVar42 = uVar42 + 1;
            uVar35 = uVar22;
          } while (uVar38 != uVar42);
          local_e8 = 0;
LAB_0010978e:
          *(ushort *)&(params->hasher).block_bits = uVar22;
        }
        else {
          local_e8 = 0;
        }
      }
LAB_001097a1:
      sVar27 = position;
    } while (position + 4 < uVar1);
  }
  else {
    local_b0 = last_insert_len;
  }
  *(ulong *)dist_cache = (local_e8 + uVar1) - position;
  *(long *)commands = *(long *)commands + ((long)local_b0 - (long)last_insert_len >> 4);
  return;
code_r0x00107ec7:
  uVar39 = uVar39 + 1;
  lVar45 = lVar45 + -8;
  piVar46 = (int *)(ringbuffer + uVar16 + uVar13);
  uVar33 = uVar16;
  if (uVar31 >> 3 == uVar39) goto LAB_00107f8e;
  goto LAB_00107eb5;
code_r0x001080c3:
  uVar23 = uVar23 + 1;
  lVar45 = lVar45 + -8;
  piVar46 = (int *)(ringbuffer + uVar16 + uVar13);
  uVar30 = uVar16;
  if (uVar31 >> 3 == uVar23) goto LAB_00108187;
  goto LAB_001080b1;
code_r0x001093a6:
  uVar13 = uVar13 + 1;
  lVar47 = lVar47 + -8;
  if (uVar31 >> 3 == uVar13) goto LAB_00109843;
  goto LAB_00109394;
code_r0x001091d6:
  uVar34 = uVar34 + 1;
  lVar32 = lVar32 + -8;
  if (bVar21 >> 3 == uVar34) goto code_r0x001091e2;
  goto LAB_001091c4;
code_r0x001091e2:
  pcVar24 = pcVar24 + -lVar32;
LAB_00109311:
  uVar17 = uVar13 & 7;
  uVar34 = sVar57;
  if ((bVar21 & 7) != 0) {
    uVar58 = sVar57 | uVar17;
    do {
      uVar34 = sVar57;
      if (*(char *)((long)piVar15 + sVar57) != *pcVar24) break;
      pcVar24 = pcVar24 + 1;
      sVar57 = sVar57 + 1;
      uVar17 = uVar17 - 1;
      uVar34 = uVar58;
    } while (uVar17 != 0);
  }
LAB_0010922c:
  if (((uVar34 == 0) || (*(uint *)(literal_context_lut + 100) + uVar34 <= uVar13)) ||
     (uVar13 = ((ulong)((uint)(*(ulong *)(literal_context_lut + 0x68) >>
                              ((char)(uVar13 - uVar34) * '\x06' & 0x3fU)) & 0x3f) +
                (uVar13 - uVar34) * 4 << (*(byte *)(lVar6 + uVar13) & 0x3f)) + uVar16 + uVar42 + 1,
     uVar37 < uVar13)) {
    bVar61 = true;
  }
  else {
    iVar25 = 0x1f;
    if ((uint)uVar13 != 0) {
      for (; (uint)uVar13 >> iVar25 == 0; iVar25 = iVar25 + -1) {
      }
    }
    uVar16 = (uVar34 * 0x87 - (ulong)(uint)(iVar25 * 0x1e)) + 0x780;
    bVar61 = true;
    if (local_100 <= uVar16) {
      iVar26 = (uint)bVar21 - (int)uVar34;
      bVar61 = false;
      sVar55 = uVar34;
      local_108 = uVar13;
      local_100 = uVar16;
    }
  }
LAB_00109290:
  if (!bVar61) {
    *(long *)(lVar47 + 0x10) = *(long *)(lVar47 + 0x10) + 1;
  }
LAB_001092aa:
  uVar38 = uVar38 + 1;
  bVar61 = lVar51 != 0;
  lVar51 = lVar51 + 1;
  if (bVar61) goto LAB_001083cb;
  goto LAB_00109158;
code_r0x00108774:
  uVar30 = uVar30 + 1;
  lVar45 = lVar45 + -8;
  if (uVar42 == uVar30) goto code_r0x00108785;
  goto LAB_00108762;
code_r0x00108785:
  uVar30 = -lVar45;
  piVar46 = (int *)((long)piVar15 - lVar45);
joined_r0x00108836:
  for (; (uVar44 != 0 && (ringbuffer[uVar30 + (uVar23 & ringbuffer_mask)] == (uint8_t)*piVar46));
      uVar30 = uVar30 + 1) {
    uVar44 = uVar44 - 1;
    piVar46 = (int *)((long)piVar46 + 1);
  }
LAB_001087a5:
  if ((bVar60) && (uVar23 = (ulong)(int)num_literals[(long)psVar28 * 2], uVar23 < uVar30 + uVar37))
  {
    uVar30 = uVar23 - uVar37;
  }
  if ((1 < uVar30) && (uVar23 = uVar30 * 0x87 + 0x78f, local_148 < uVar23)) {
    if (lVar43 != 0) {
      uVar23 = uVar23 - ((0x1ca10U >> ((byte)lVar43 & 2) & 4) + 0x27);
    }
    if (local_148 < uVar23) {
      sVar57 = uVar30;
      uVar58 = uVar23;
      local_148 = uVar23;
      local_128 = uVar33;
      local_118 = uVar30;
    }
  }
LAB_0010881d:
  lVar43 = lVar43 + 1;
  if (lVar43 == 4) goto LAB_0010885c;
  goto LAB_00108711;
LAB_0010885c:
  lVar43 = *(long *)&(params->hasher).num_last_distances_to_check;
  uVar44 = uVar37 - *(uint *)(lVar47 + uVar20 * 4);
  uVar35 = *(ushort *)(lVar47 + 0x20000 + uVar20 * 2);
  uVar33 = (ulong)uVar35;
  uVar23 = (ulong)((uint)uVar31 & 7);
  uVar30 = 0;
  uVar39 = uVar44;
LAB_001088a1:
  bVar61 = lVar43 != 0;
  lVar43 = lVar43 + -1;
  if (bVar61) {
    uVar30 = uVar30 + uVar39;
    uVar56 = sVar57;
    uVar59 = uVar58;
    uVar41 = local_148;
    uVar9 = local_128;
    uVar10 = local_118;
    if (uVar30 <= uVar13) {
      uVar56 = (ulong)*(ushort *)(lVar47 + 0x40002 + uVar33 * 4);
      uVar39 = (ulong)*(ushort *)(lVar47 + 0x40000 + uVar33 * 4);
      uVar33 = uVar56;
      if (uVar17 + local_118 <= ringbuffer_mask) {
        uVar59 = uVar37 - uVar30 & ringbuffer_mask;
        if ((ringbuffer_mask < local_118 + uVar59) ||
           (ringbuffer[uVar17 + local_118] != ringbuffer[local_118 + uVar59])) goto LAB_001089dc;
        uVar41 = uVar23;
        if (7 < uVar31) {
          local_c8 = 0;
          uVar56 = 0;
LAB_00108937:
          if (*(ulong *)(piVar15 + uVar56 * 2) == *(ulong *)(ringbuffer + uVar56 * 8 + uVar59))
          goto code_r0x00108949;
          uVar59 = *(ulong *)(ringbuffer + uVar56 * 8 + uVar59) ^ *(ulong *)(piVar15 + uVar56 * 2);
          uVar56 = 0;
          if (uVar59 != 0) {
            for (; (uVar59 >> uVar56 & 1) == 0; uVar56 = uVar56 + 1) {
            }
          }
          uVar56 = (uVar56 >> 3 & 0x1fffffff) - local_c8;
          goto LAB_0010898a;
        }
        uVar56 = 0;
        piVar46 = piVar15;
        goto joined_r0x00108a09;
      }
      goto LAB_001089dc;
    }
    goto LAB_001089e2;
  }
  goto LAB_00108a5a;
code_r0x00108949:
  uVar56 = uVar56 + 1;
  local_c8 = local_c8 + -8;
  if (uVar42 == uVar56) goto code_r0x0010895f;
  goto LAB_00108937;
code_r0x0010895f:
  uVar56 = -local_c8;
  piVar46 = (int *)((long)piVar15 - local_c8);
joined_r0x00108a09:
  for (; (uVar41 != 0 && (ringbuffer[uVar56 + uVar59] == (uint8_t)*piVar46)); uVar56 = uVar56 + 1) {
    uVar41 = uVar41 - 1;
    piVar46 = (int *)((long)piVar46 + 1);
  }
LAB_0010898a:
  if ((bVar60) && (uVar59 = (ulong)(int)num_literals[(long)psVar28 * 2], uVar59 < uVar56 + uVar37))
  {
    uVar56 = uVar59 - uVar37;
  }
  if (3 < uVar56) {
    iVar11 = 0x1f;
    if ((uint)uVar30 != 0) {
      for (; (uint)uVar30 >> iVar11 == 0; iVar11 = iVar11 + -1) {
      }
    }
    uVar59 = (ulong)(iVar11 * -0x1e + 0x780) + uVar56 * 0x87;
    uVar41 = uVar59;
    uVar9 = uVar30;
    uVar10 = uVar56;
    if (local_148 < uVar59) goto LAB_001089e2;
  }
LAB_001089dc:
  uVar56 = sVar57;
  uVar59 = uVar58;
  uVar41 = local_148;
  uVar9 = local_128;
  uVar10 = local_118;
LAB_001089e2:
  local_118 = uVar10;
  local_128 = uVar9;
  local_148 = uVar41;
  uVar58 = uVar59;
  sVar57 = uVar56;
  if (uVar13 < uVar30) goto LAB_00108a5a;
  goto LAB_001088a1;
LAB_00108a5a:
  uVar22 = (ushort)(params->hasher).block_bits;
  *(ushort *)&(params->hasher).block_bits = uVar22 + 1;
  *(char *)(lVar47 + 0x30000 + (uVar37 & 0xffff)) = cVar48;
  if (0xfffe < uVar44) {
    uVar44 = 0xffff;
  }
  *(short *)(lVar47 + 0x40000 + (ulong)uVar22 * 4) = (short)uVar44;
  *(ushort *)(lVar47 + 0x40002 + (ulong)uVar22 * 4) = uVar35;
  *(int *)(lVar47 + uVar20 * 4) = (int)uVar37;
  *(ushort *)(lVar47 + 0x20000 + uVar20 * 2) = uVar22;
  bVar60 = false;
  goto LAB_00108acf;
code_r0x00108f54:
  uVar58 = uVar58 + 1;
  lVar47 = lVar47 + -8;
  if (uVar42 == uVar58) goto code_r0x00108f60;
  goto LAB_00108f42;
code_r0x00108f60:
  uVar42 = -lVar47;
  piVar46 = (int *)((long)piVar15 - lVar47);
LAB_00109018:
  uVar58 = uVar31 & 7;
  for (; (uVar58 != 0 && (ringbuffer[uVar42 + uVar17] == (uint8_t)*piVar46)); uVar42 = uVar42 + 1) {
    piVar46 = (int *)((long)piVar46 + 1);
    uVar58 = uVar58 - 1;
  }
LAB_00108f80:
  sVar57 = (size_t)*(int *)((long)num_literals + (long)psVar28 * 0x10 + 4);
  if (uVar42 < sVar57) {
    sVar57 = uVar42;
  }
  iVar11 = 0x1f;
  if (uVar49 != 0) {
    for (; uVar49 >> iVar11 == 0; iVar11 = iVar11 + -1) {
    }
  }
  uVar58 = (ulong)(iVar11 * -0x1e + 0x780) + sVar57 * 0x87;
  bVar60 = true;
  bVar61 = false;
LAB_00108fb9:
  iVar11 = 0;
  if (!bVar61) goto LAB_00108c33;
LAB_00108acf:
  iVar11 = 0;
  if (uVar58 == 0x7e4) {
    if (back_refs_position == (size_t *)0x0) {
      lVar47 = *(long *)&(params->dist).alphabet_size_max;
      if (*(ulong *)(lVar47 + 8) >> 7 <= *(ulong *)(lVar47 + 0x10)) {
        uVar42 = (ulong)((uint)(*piVar15 * 0x1e35a7bd) >> 0x11 & 0xfffffffe);
        lVar43 = *(long *)(literal_context_lut + 0x78);
        lVar45 = *(long *)(lVar47 + 8);
        iVar11 = 0;
        lVar51 = 0;
LAB_00108d3d:
        lVar45 = lVar45 + 1;
        *(long *)(lVar47 + 8) = lVar45;
        bVar21 = *(byte *)(lVar43 + uVar42);
        uVar13 = (ulong)bVar21;
        if (uVar13 != 0) {
          bVar61 = true;
          if (uVar13 <= uVar31) {
            uVar17 = (ulong)*(ushort *)(*(long *)(literal_context_lut + 0x70) + uVar42 * 2);
            lVar6 = *(long *)(literal_context_lut + 0x58);
            pcVar24 = (char *)(uVar17 * uVar13 + *(long *)(lVar6 + 0xa8) +
                              (ulong)*(uint *)(lVar6 + 0x20 + uVar13 * 4));
            if (7 < bVar21) {
              sVar29 = (size_t)(bVar21 & 0xfffffff8);
              lVar32 = 0;
              uVar20 = 0;
LAB_00108dc6:
              if (*(ulong *)(pcVar24 + uVar20 * 8) == *(ulong *)(piVar15 + uVar20 * 2))
              goto code_r0x00108dd8;
              uVar39 = *(ulong *)(piVar15 + uVar20 * 2) ^ *(ulong *)(pcVar24 + uVar20 * 8);
              uVar20 = 0;
              if (uVar39 != 0) {
                for (; (uVar39 >> uVar20 & 1) == 0; uVar20 = uVar20 + 1) {
                }
              }
              uVar20 = (uVar20 >> 3 & 0x1fffffff) - lVar32;
              goto LAB_00108e12;
            }
            sVar29 = 0;
            goto LAB_00108ec4;
          }
          goto LAB_00108d55;
        }
        goto LAB_00108d6a;
      }
    }
    else {
      psVar28 = *(size_t **)backward_references;
      if ((psVar28 < back_refs_position) && (uVar37 == (long)(int)num_literals[(long)psVar28 * 2]))
      {
        uVar49 = (uint)num_literals[(long)psVar28 * 2 + 1];
        uVar42 = (ulong)(int)uVar49;
        if (*(int *)((long)num_literals + (long)psVar28 * 0x10 + 0xc) < (int)uVar49) {
          uVar52 = *(uint *)((long)num_literals + (long)psVar28 * 0x10 + 4);
          uVar16 = (ulong)uVar52;
          bVar60 = true;
          if (uVar52 - 4 < 0x15 && (int)uVar49 < 0x7ffffffd) {
            uVar53 = ~(uint)uVar13 + uVar49;
            lVar47 = *(long *)(literal_context_lut + 0x58);
            iVar54 = (int)uVar53 >> (*(byte *)(lVar47 + uVar16) & 0x1f);
            if (iVar54 < *(int *)(literal_context_lut + 0x60)) {
              uVar3 = *(uint *)(lVar47 + 0x20 + uVar16 * 4);
              uVar4 = kBitMask[*(byte *)(lVar47 + uVar16)];
              lVar47 = *(long *)(lVar47 + 0xa8);
              uVar18 = BrotliGetTransforms();
              pvVar19 = malloc(uVar16 * 10);
              iVar11 = BrotliTransformDictionaryWord
                                 (pvVar19,(ulong)uVar3 + lVar47 +
                                          (long)(int)((uVar53 & uVar4) * uVar52),uVar16,uVar18,
                                  iVar54);
              sVar29 = (size_t)iVar11;
              iVar54 = bcmp(piVar15,pvVar19,sVar29);
              if (iVar54 == 0) {
                iVar54 = 0x1f;
                if (uVar49 != 0) {
                  for (; uVar49 >> iVar54 == 0; iVar54 = iVar54 + -1) {
                  }
                }
                uVar58 = (ulong)(iVar54 * -0x1e + 0x780) + sVar29 * 0x87;
                iVar11 = uVar52 - iVar11;
              }
              else {
                iVar11 = 0;
                uVar42 = local_128;
                sVar29 = sVar57;
              }
              bVar60 = true;
              local_128 = uVar42;
              sVar57 = sVar29;
            }
          }
        }
      }
    }
  }
LAB_00108c33:
  bVar61 = true;
  if ((bVar60) || (local_108 = local_d0, uVar42 = sVar27, local_100 + 0xaf <= uVar58)) {
    local_e8 = local_e8 + 1;
    iVar26 = iVar25 + 1;
    bVar7 = iVar25 < 3;
    local_108 = local_128;
    sVar55 = sVar57;
    uVar42 = uVar37;
    local_100 = uVar58;
    iVar25 = iVar26;
    iVar26 = iVar11;
    if (bVar7 && !bVar60) {
      bVar61 = uVar1 <= sVar27 + 5;
    }
  }
  sVar27 = uVar42;
  uVar38 = uVar38 - 1;
  local_d0 = local_108;
  if (bVar61) goto LAB_00108407;
  goto LAB_00108550;
code_r0x00108dd8:
  uVar20 = uVar20 + 1;
  lVar32 = lVar32 + -8;
  if (bVar21 >> 3 == uVar20) goto code_r0x00108de4;
  goto LAB_00108dc6;
code_r0x00108de4:
  pcVar24 = pcVar24 + -lVar32;
LAB_00108ec4:
  uVar39 = uVar13 & 7;
  uVar20 = sVar29;
  if ((bVar21 & 7) != 0) {
    uVar33 = sVar29 | uVar39;
    do {
      uVar20 = sVar29;
      if (*(char *)((long)piVar15 + sVar29) != *pcVar24) break;
      pcVar24 = pcVar24 + 1;
      sVar29 = sVar29 + 1;
      uVar39 = uVar39 - 1;
      uVar20 = uVar33;
    } while (uVar39 != 0);
  }
LAB_00108e12:
  bVar61 = true;
  if (((uVar20 != 0) && (uVar13 < *(uint *)(literal_context_lut + 100) + uVar20)) &&
     (uVar13 = ((ulong)((uint)(*(ulong *)(literal_context_lut + 0x68) >>
                              ((char)(uVar13 - uVar20) * '\x06' & 0x3fU)) & 0x3f) +
                (uVar13 - uVar20) * 4 << (*(byte *)(lVar6 + uVar13) & 0x3f)) + uVar17 + uVar16 + 1,
     uVar13 <= uVar34)) {
    iVar54 = 0x1f;
    if ((uint)uVar13 != 0) {
      for (; (uint)uVar13 >> iVar54 == 0; iVar54 = iVar54 + -1) {
      }
    }
    uVar17 = (uVar20 * 0x87 - (ulong)(uint)(iVar54 * 0x1e)) + 0x780;
    if (uVar58 <= uVar17) {
      iVar11 = (uint)bVar21 - (int)uVar20;
      bVar61 = false;
      sVar57 = uVar20;
      uVar58 = uVar17;
      local_128 = uVar13;
    }
  }
LAB_00108d55:
  if (!bVar61) {
    *(long *)(lVar47 + 0x10) = *(long *)(lVar47 + 0x10) + 1;
  }
LAB_00108d6a:
  uVar42 = uVar42 + 1;
  bVar61 = lVar51 != 0;
  lVar51 = lVar51 + 1;
  if (bVar61) goto LAB_00108c33;
  goto LAB_00108d3d;
}

Assistant:

static BROTLI_NOINLINE void EXPORT_FN(CreateBackwardReferences)(
    size_t num_bytes, size_t position,
    const uint8_t* ringbuffer, size_t ringbuffer_mask,
    ContextLut literal_context_lut, const BrotliEncoderParams* params,
    Hasher* hasher, int* dist_cache, size_t* last_insert_len,
    Command* commands, size_t* num_commands, size_t* num_literals,
    const BackwardReferenceFromDecoder* backward_references,
    size_t* back_refs_position, size_t back_refs_size) {
  HASHER()* privat = &hasher->privat.FN(_);
  /* Set maximum distance, see section 9.1. of the spec. */
  const size_t max_backward_limit = BROTLI_MAX_BACKWARD_LIMIT(params->lgwin);
  const size_t position_offset = params->stream_offset;

  const Command* const orig_commands = commands;
  size_t insert_length = *last_insert_len;
  const size_t pos_end = position + num_bytes;
  const size_t store_end = num_bytes >= FN(StoreLookahead)() ?
      position + num_bytes - FN(StoreLookahead)() + 1 : position;

  /* For speed up heuristics for random data. */
  const size_t random_heuristics_window_size =
      LiteralSpreeLengthForSparseSearch(params);
  size_t apply_random_heuristics = position + random_heuristics_window_size;
  const size_t gap = 0;

  /* Minimum score to accept a backward reference. */
  const score_t kMinScore = BROTLI_SCORE_BASE + 100;

  BROTLI_UNUSED(literal_context_lut);

  FN(PrepareDistanceCache)(privat, dist_cache);

  while (position + FN(HashTypeLength)() < pos_end) {
    size_t max_length = pos_end - position;
    size_t max_distance = BROTLI_MIN(size_t, position, max_backward_limit);
    size_t dictionary_start = BROTLI_MIN(size_t,
        position + position_offset, max_backward_limit);
    HasherSearchResult sr;
    sr.len = 0;
    sr.len_code_delta = 0;
    sr.distance = 0;
    sr.score = kMinScore;
    sr.used_stored = BROTLI_FALSE;
    FN(FindLongestMatch)(privat, &params->dictionary,
        ringbuffer, ringbuffer_mask, dist_cache, position, max_length,
        max_distance, dictionary_start + gap, params->dist.max_distance,
        backward_references, back_refs_position, back_refs_size, &sr);
    if (sr.score > kMinScore) {
      /* Found a match. Let's look for something even better ahead. */
      int delayed_backward_references_in_row = 0;
      --max_length;
      /* If a reference from backward_references array was found
         then just take it */
      if (!sr.used_stored) {
          for (;; --max_length) {
            const score_t cost_diff_lazy = 175;
            HasherSearchResult sr2;
            sr2.len = params->quality < MIN_QUALITY_FOR_EXTENSIVE_REFERENCE_SEARCH ?
                BROTLI_MIN(size_t, sr.len - 1, max_length) : 0;
            sr2.len_code_delta = 0;
            sr2.distance = 0;
            sr2.score = kMinScore;
            sr2.used_stored = BROTLI_FALSE;
            max_distance = BROTLI_MIN(size_t, position + 1, max_backward_limit);
            dictionary_start = BROTLI_MIN(size_t,
                position + 1 + position_offset, max_backward_limit);
            FN(FindLongestMatch)(privat,
                &params->dictionary,
                ringbuffer, ringbuffer_mask, dist_cache, position + 1, max_length,
                max_distance, dictionary_start + gap, params->dist.max_distance,
                backward_references, back_refs_position, back_refs_size, &sr2);
            if (sr2.score >= sr.score + cost_diff_lazy || sr2.used_stored) {
              /* Ok, let's just write one byte for now and start a match from the
                 next byte. */
              ++position;
              ++insert_length;
              sr = sr2;
              /* If a reference from backward_references array was found
                 then just take it */
              if (sr2.used_stored) {
                ++delayed_backward_references_in_row;
                break;
              }
              if (++delayed_backward_references_in_row < 4 &&
                  position + FN(HashTypeLength)() < pos_end) {
                continue;
              }
            }
            break;
          }
      }
      apply_random_heuristics =
          position + 2 * sr.len + random_heuristics_window_size;
      dictionary_start = BROTLI_MIN(size_t,
          position + position_offset, max_backward_limit);
      {
        /* The first 16 codes are special short-codes,
           and the minimum offset is 1. */
        size_t distance_code = ComputeDistanceCode(
            sr.distance, dictionary_start + gap, dist_cache);
        if ((sr.distance <= (dictionary_start + gap)) && distance_code > 0) {
          dist_cache[3] = dist_cache[2];
          dist_cache[2] = dist_cache[1];
          dist_cache[1] = dist_cache[0];
          dist_cache[0] = (int)sr.distance;
          FN(PrepareDistanceCache)(privat, dist_cache);
        }
        InitCommand(commands++, &params->dist, insert_length,
            sr.len, sr.len_code_delta, distance_code);
      }
      *num_literals += insert_length;
      insert_length = 0;
      /* Put the hash keys into the table, if there are enough bytes left.
         Depending on the hasher implementation, it can push all positions
         in the given range or only a subset of them.
         Avoid hash poisoning with RLE data. */
      {
        size_t range_start = position + 2;
        size_t range_end = BROTLI_MIN(size_t, position + sr.len, store_end);
        if (sr.distance < (sr.len >> 2)) {
          range_start = BROTLI_MIN(size_t, range_end, BROTLI_MAX(size_t,
              range_start, position + sr.len - (sr.distance << 2)));
        }
        FN(StoreRange)(privat, ringbuffer, ringbuffer_mask, range_start,
                       range_end);
      }
      position += sr.len;
    } else {
      ++insert_length;
      ++position;
      /* If we have not seen matches for a long time, we can skip some
         match lookups. Unsuccessful match lookups are very very expensive
         and this kind of a heuristic speeds up compression quite
         a lot. */
      if (position > apply_random_heuristics && back_refs_size == 0) {
        /* Going through uncompressible data, jump. */
        if (position >
            apply_random_heuristics + 4 * random_heuristics_window_size) {
          /* It is quite a long time since we saw a copy, so we assume
             that this data is not compressible, and store hashes less
             often. Hashes of non compressible data are less likely to
             turn out to be useful in the future, too, so we store less of
             them to not to flood out the hash table of good compressible
             data. */
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 4);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 16, pos_end - kMargin);
          for (; position < pos_jump; position += 4) {
            FN(Store)(privat, ringbuffer, ringbuffer_mask, position);
            insert_length += 4;
          }
        } else {
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 2);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 8, pos_end - kMargin);
          for (; position < pos_jump; position += 2) {
            FN(Store)(privat, ringbuffer, ringbuffer_mask, position);
            insert_length += 2;
          }
        }
      }
    }
  }
  insert_length += pos_end - position;
  *last_insert_len = insert_length;
  *num_commands += (size_t)(commands - orig_commands);
}